

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void decoder_model_init(AV1_COMP *cpi,AV1_LEVEL level,int op_index,DECODER_MODEL *decoder_model)

{
  long lVar1;
  undefined1 *in_RCX;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  double dVar2;
  DFG_INTERVAL_QUEUE *dfg_interval_queue;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  DECODER_MODEL *in_stack_ffffffffffffffd0;
  
  *in_RCX = 0;
  in_RCX[3] = in_SIL;
  lVar1 = *(long *)(in_RDI + 0x42008);
  dVar2 = get_max_bitrate(av1_level_defs + (int)(uint)in_SIL,
                          (uint)*(byte *)(lVar1 + 0x141 + (long)in_EDX),
                          *(BITSTREAM_PROFILE *)(lVar1 + 0x45));
  *(double *)(in_RCX + 0x38) = dVar2;
  in_RCX[1] = 0;
  *(undefined4 *)(in_RCX + 4) = 20000;
  *(undefined4 *)(in_RCX + 8) = 70000;
  in_RCX[2] = 0;
  *(undefined8 *)(in_RCX + 0x770) = 0;
  *(undefined8 *)(in_RCX + 0x778) = 0;
  *(undefined8 *)(in_RCX + 0x780) = 0;
  *(undefined8 *)(in_RCX + 0x788) = 0xbff0000000000000;
  *(undefined8 *)(in_RCX + 0x790) = 0xbff0000000000000;
  *(undefined4 *)(in_RCX + 0x798) = 0;
  *(undefined4 *)(in_RCX + 0x79c) = 0;
  *(undefined8 *)(in_RCX + 0x7a8) = 0;
  *(undefined8 *)(in_RCX + 0x7a0) = 0;
  *(undefined4 *)(in_RCX + 0x40) = 0xffffffff;
  *(undefined4 *)(in_RCX + 0x44) = 0xffffffff;
  *(undefined4 *)(in_RCX + 0x48) = 0xffffffff;
  *(undefined8 *)(in_RCX + 0x28) = 0;
  initialize_buffer_pool(in_stack_ffffffffffffffd0);
  *(undefined8 *)(in_RCX + 0x168) = 0;
  *(undefined4 *)(in_RCX + 0x160) = 0;
  *(undefined4 *)(in_RCX + 0x164) = 0;
  if (*(int *)(lVar1 + 0xf8) == 0) {
    *(undefined4 *)(in_RCX + 0xc) = 1;
    *(double *)(in_RCX + 0x20) = 1.0 / *(double *)(in_RDI + 0x608b0);
  }
  else {
    *(undefined4 *)(in_RCX + 0xc) = *(undefined4 *)(lVar1 + 0x108);
    *(double *)(in_RCX + 0x20) =
         (double)((ulong)*(uint *)(lVar1 + 0xfc) / (ulong)*(uint *)(lVar1 + 0x100));
  }
  *(undefined4 *)(in_RCX + 0x10) = *(undefined4 *)(lVar1 + (long)in_EDX * 0x30 + 400);
  *(undefined8 *)(in_RCX + 0x30) = 0xbff0000000000000;
  *(int64_t *)(in_RCX + 0x18) = av1_level_defs[in_SIL].max_decode_rate;
  return;
}

Assistant:

static void decoder_model_init(const AV1_COMP *const cpi, AV1_LEVEL level,
                               int op_index,
                               DECODER_MODEL *const decoder_model) {
  decoder_model->status = DECODER_MODEL_OK;
  decoder_model->level = level;

  const AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  decoder_model->bit_rate = get_max_bitrate(
      av1_level_defs + level, seq_params->tier[op_index], seq_params->profile);

  // TODO(huisu or anyone): implement SCHEDULE_MODE.
  decoder_model->mode = RESOURCE_MODE;
  decoder_model->encoder_buffer_delay = 20000;
  decoder_model->decoder_buffer_delay = 70000;
  decoder_model->is_low_delay_mode = false;

  decoder_model->first_bit_arrival_time = 0.0;
  decoder_model->last_bit_arrival_time = 0.0;
  decoder_model->coded_bits = 0;

  decoder_model->removal_time = INVALID_TIME;
  decoder_model->presentation_time = INVALID_TIME;
  decoder_model->decode_samples = 0;
  decoder_model->display_samples = 0;
  decoder_model->max_decode_rate = 0.0;
  decoder_model->max_display_rate = 0.0;

  decoder_model->num_frame = -1;
  decoder_model->num_decoded_frame = -1;
  decoder_model->num_shown_frame = -1;
  decoder_model->current_time = 0.0;

  initialize_buffer_pool(decoder_model);

  DFG_INTERVAL_QUEUE *const dfg_interval_queue =
      &decoder_model->dfg_interval_queue;
  dfg_interval_queue->total_interval = 0.0;
  dfg_interval_queue->head = 0;
  dfg_interval_queue->size = 0;

  if (seq_params->timing_info_present) {
    decoder_model->num_ticks_per_picture =
        seq_params->timing_info.num_ticks_per_picture;
    decoder_model->display_clock_tick =
        seq_params->timing_info.num_units_in_display_tick /
        seq_params->timing_info.time_scale;
  } else {
    decoder_model->num_ticks_per_picture = 1;
    decoder_model->display_clock_tick = 1.0 / cpi->framerate;
  }

  decoder_model->initial_display_delay =
      seq_params->op_params[op_index].initial_display_delay;
  decoder_model->initial_presentation_delay = INVALID_TIME;
  decoder_model->decode_rate = av1_level_defs[level].max_decode_rate;
}